

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O2

void __thiscall
cfgfile::
tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::~tag_scalar_t(tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
                *this)

{
  (this->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t =
       (_func_int **)&PTR__tag_scalar_t_00136b18;
  std::__cxx11::string::~string((string *)&this->m_value);
  tag_t<cfgfile::string_trait_t>::~tag_t(&this->super_tag_t<cfgfile::string_trait_t>);
  return;
}

Assistant:

~tag_scalar_t()
	{
	}